

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor_rational.h
# Opt level: O0

void __thiscall soplex::SLUFactorRational::SLUFactorRational(SLUFactorRational *this)

{
  Timer *pTVar1;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *pnVar2;
  EVP_PKEY_CTX *ctx;
  SLUFactorRational *in_RDI;
  SPxMemoryException *x;
  nullptr_t in_stack_fffffffffffffeb8;
  undefined2 in_stack_fffffffffffffec0;
  undefined6 in_stack_fffffffffffffec2;
  int in_stack_fffffffffffffecc;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffffed0;
  shared_ptr<soplex::Tolerances> *in_stack_fffffffffffffee0;
  TYPE ttype;
  undefined8 in_stack_fffffffffffffee8;
  int p_dim;
  CLUFactorRational *in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffefc;
  Dring **in_stack_ffffffffffffff00;
  VectorRational *pVVar3;
  undefined8 uVar4;
  undefined2 in_stack_ffffffffffffff78;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  *in_stack_ffffffffffffff88;
  
  p_dim = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  SLinSolverRational::SLinSolverRational(&in_RDI->super_SLinSolverRational);
  memset(&in_RDI->super_CLUFactorRational,0,0x2b0);
  CLUFactorRational::CLUFactorRational(in_stack_fffffffffffffef0);
  (((vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
     *)&in_RDI->super_SLinSolverRational)->
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_getName_00895580;
  pVVar3 = &in_RDI->vec;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)
             CONCAT62(in_stack_fffffffffffffec2,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8
            );
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::SSVectorBase((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffffef0,p_dim,in_stack_fffffffffffffee0);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1fe308);
  in_RDI->usetup = false;
  in_RDI->uptype = FOREST_TOMLIN;
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)
             CONCAT62(in_stack_fffffffffffffec2,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8
            );
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::SSVectorBase((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffffef0,p_dim,in_stack_fffffffffffffee0);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1fe36b);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)
             CONCAT62(in_stack_fffffffffffffec2,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8
            );
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::SSVectorBase((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffffef0,p_dim,in_stack_fffffffffffffee0);
  ttype = (TYPE)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1fe3b7);
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x1fe3df);
  uVar4 = 0x3f847ae147ae147b;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x1fe43e);
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
  ::operator=(in_stack_ffffffffffffff88,(longdouble)CONCAT28(in_stack_ffffffffffffff78,uVar4));
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x1fe4d0);
  in_RDI->timerType = USER_TIME;
  (in_RDI->super_CLUFactorRational).row.perm = (int *)0x0;
  (in_RDI->super_CLUFactorRational).row.orig = (int *)0x0;
  (in_RDI->super_CLUFactorRational).col.perm = (int *)0x0;
  (in_RDI->super_CLUFactorRational).col.orig = (int *)0x0;
  (in_RDI->super_CLUFactorRational).u.row.elem = (Dring *)0x0;
  (in_RDI->super_CLUFactorRational).u.row.idx = (int *)0x0;
  (in_RDI->super_CLUFactorRational).u.row.start = (int *)0x0;
  (in_RDI->super_CLUFactorRational).u.row.len = (int *)0x0;
  (in_RDI->super_CLUFactorRational).u.row.max = (int *)0x0;
  (in_RDI->super_CLUFactorRational).u.col.elem = (Dring *)0x0;
  (in_RDI->super_CLUFactorRational).u.col.idx = (int *)0x0;
  (in_RDI->super_CLUFactorRational).u.col.start = (int *)0x0;
  (in_RDI->super_CLUFactorRational).u.col.len = (int *)0x0;
  (in_RDI->super_CLUFactorRational).u.col.max = (int *)0x0;
  (in_RDI->super_CLUFactorRational).l.idx = (int *)0x0;
  (in_RDI->super_CLUFactorRational).l.start = (int *)0x0;
  (in_RDI->super_CLUFactorRational).l.row = (int *)0x0;
  (in_RDI->super_CLUFactorRational).l.ridx = (int *)0x0;
  (in_RDI->super_CLUFactorRational).l.rbeg = (int *)0x0;
  (in_RDI->super_CLUFactorRational).l.rorig = (int *)0x0;
  (in_RDI->super_CLUFactorRational).l.rperm = (int *)0x0;
  (in_RDI->super_CLUFactorRational).nzCnt = 0;
  (in_RDI->super_CLUFactorRational).thedim = 0;
  pTVar1 = TimerFactory::createTimer(ttype);
  in_RDI->solveTime = pTVar1;
  pTVar1 = TimerFactory::createTimer(ttype);
  (in_RDI->super_CLUFactorRational).factorTime = pTVar1;
  spx_alloc<int*>((int **)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  spx_alloc<int*>((int **)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  spx_alloc<int*>((int **)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  spx_alloc<int*>((int **)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)in_RDI,(int)((ulong)pVVar3 >> 0x20),SUB81((ulong)pVVar3 >> 0x18,0));
  pnVar2 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           ::get_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)0x1fe6c4);
  (in_RDI->super_CLUFactorRational).work = pnVar2;
  (in_RDI->super_CLUFactorRational).u.row.used = 0;
  spx_alloc<soplex::CLUFactorRational::Dring*>(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)in_RDI,(int)((ulong)pVVar3 >> 0x20),SUB81((ulong)pVVar3 >> 0x18,0));
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::dim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
         *)0x1fe733);
  spx_alloc<int*>((int **)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  spx_alloc<int*>((int **)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  spx_alloc<int*>((int **)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  spx_alloc<int*>((int **)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  (in_RDI->super_CLUFactorRational).u.row.list.idx = (in_RDI->super_CLUFactorRational).thedim;
  (in_RDI->super_CLUFactorRational).u.row.start[(in_RDI->super_CLUFactorRational).thedim] = 0;
  (in_RDI->super_CLUFactorRational).u.row.max[(in_RDI->super_CLUFactorRational).thedim] = 0;
  (in_RDI->super_CLUFactorRational).u.row.len[(in_RDI->super_CLUFactorRational).thedim] = 0;
  (in_RDI->super_CLUFactorRational).u.col.size = 1;
  (in_RDI->super_CLUFactorRational).u.col.used = 0;
  spx_alloc<soplex::CLUFactorRational::Dring*>(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  spx_alloc<int*>((int **)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  spx_alloc<int*>((int **)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  spx_alloc<int*>((int **)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  spx_alloc<int*>((int **)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)in_RDI,(int)((ulong)pVVar3 >> 0x20),SUB81((ulong)pVVar3 >> 0x18,0));
  (in_RDI->super_CLUFactorRational).u.col.list.idx = (in_RDI->super_CLUFactorRational).thedim;
  (in_RDI->super_CLUFactorRational).u.col.start[(in_RDI->super_CLUFactorRational).thedim] = 0;
  (in_RDI->super_CLUFactorRational).u.col.max[(in_RDI->super_CLUFactorRational).thedim] = 0;
  (in_RDI->super_CLUFactorRational).u.col.len[(in_RDI->super_CLUFactorRational).thedim] = 0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)in_RDI,(int)((ulong)pVVar3 >> 0x20),SUB81((ulong)pVVar3 >> 0x18,0));
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::dim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
         *)0x1fe91e);
  spx_alloc<int*>((int **)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  (in_RDI->super_CLUFactorRational).l.startSize = 1;
  (in_RDI->super_CLUFactorRational).l.firstUpdate = 0;
  (in_RDI->super_CLUFactorRational).l.firstUnused = 0;
  spx_alloc<int*>((int **)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  spx_alloc<int*>((int **)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  ctx = (EVP_PKEY_CTX *)0x0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)in_RDI,(int)((ulong)pVVar3 >> 0x20),SUB81((ulong)pVVar3 >> 0x18,0));
  (in_RDI->super_CLUFactorRational).l.ridx = (int *)0x0;
  (in_RDI->super_CLUFactorRational).l.rbeg = (int *)0x0;
  (in_RDI->super_CLUFactorRational).l.rorig = (int *)0x0;
  (in_RDI->super_CLUFactorRational).l.rperm = (int *)0x0;
  init(in_RDI,ctx);
  (in_RDI->super_CLUFactorRational).factorCount = 0;
  (in_RDI->super_CLUFactorRational).timeLimit = -1.0;
  in_RDI->solveCount = 0;
  return;
}

Assistant:

SLUFactorRational()
      : CLUFactorRational()
      , vec(1)
      , ssvec(1)
      , usetup(false)
      , uptype(FOREST_TOMLIN)
      , eta(1)
      , forest(1)
      , minThreshold(0.01)
      , timerType(Timer::USER_TIME)
   {
      row.perm    = nullptr;
      row.orig    = nullptr;
      col.perm    = nullptr;
      col.orig    = nullptr;
      u.row.elem  = nullptr;
      u.row.idx   = nullptr;
      u.row.start = nullptr;
      u.row.len   = nullptr;
      u.row.max   = nullptr;
      u.col.elem  = nullptr;
      u.col.idx   = nullptr;
      u.col.start = nullptr;
      u.col.len   = nullptr;
      u.col.max   = nullptr;
      l.idx       = nullptr;
      l.start     = nullptr;
      l.row       = nullptr;
      l.ridx      = nullptr;
      l.rbeg      = nullptr;
      l.rorig     = nullptr;
      l.rperm     = nullptr;

      nzCnt  = 0;
      thedim = 0;

      try
      {
         solveTime = TimerFactory::createTimer(timerType);
         factorTime = TimerFactory::createTimer(timerType);
         spx_alloc(row.perm, thedim);
         spx_alloc(row.orig, thedim);
         spx_alloc(col.perm, thedim);
         spx_alloc(col.orig, thedim);
         diag.reDim(thedim);

         work = vec.get_ptr();

         u.row.used = 0;
         spx_alloc(u.row.elem,  thedim);
         u.row.val.reDim(1);
         spx_alloc(u.row.idx,   u.row.val.dim());
         spx_alloc(u.row.start, thedim + 1);
         spx_alloc(u.row.len,   thedim + 1);
         spx_alloc(u.row.max,   thedim + 1);

         u.row.list.idx      = thedim;
         u.row.start[thedim] = 0;
         u.row.max  [thedim] = 0;
         u.row.len  [thedim] = 0;

         u.col.size = 1;
         u.col.used = 0;
         spx_alloc(u.col.elem,  thedim);
         spx_alloc(u.col.idx,   u.col.size);
         spx_alloc(u.col.start, thedim + 1);
         spx_alloc(u.col.len,   thedim + 1);
         spx_alloc(u.col.max,   thedim + 1);
         u.col.val.reDim(0);

         u.col.list.idx      = thedim;
         u.col.start[thedim] = 0;
         u.col.max[thedim]   = 0;
         u.col.len[thedim]   = 0;

         l.val.reDim(1);
         spx_alloc(l.idx, l.val.dim());

         l.startSize   = 1;
         l.firstUpdate = 0;
         l.firstUnused = 0;

         spx_alloc(l.start, l.startSize);
         spx_alloc(l.row,   l.startSize);
      }
      catch(const SPxMemoryException& x)
      {
         freeAll();
         throw x;
      }

      l.rval.reDim(0);
      l.ridx  = nullptr;
      l.rbeg  = nullptr;
      l.rorig = nullptr;
      l.rperm = nullptr;

      SLUFactorRational::init();

      factorCount = 0;
      timeLimit = -1.0;
      solveCount  = 0;

      assert(row.perm != nullptr);
      assert(row.orig != nullptr);
      assert(col.perm != nullptr);
      assert(col.orig != nullptr);

      assert(u.row.elem  != nullptr);
      assert(u.row.idx   != nullptr);
      assert(u.row.start != nullptr);
      assert(u.row.len   != nullptr);
      assert(u.row.max   != nullptr);

      assert(u.col.elem  != nullptr);
      assert(u.col.idx   != nullptr);
      assert(u.col.start != nullptr);
      assert(u.col.len   != nullptr);
      assert(u.col.max   != nullptr);

      assert(l.idx   != nullptr);
      assert(l.start != nullptr);
      assert(l.row   != nullptr);

      assert(SLUFactorRational::isConsistent());
   }